

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow38_00010_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double factor;
  Index in_stack_ffffffffffffff88;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_ffffffffffffff90;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x9d71f1);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d720f);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d7233);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d725b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d7279);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *pSVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar9,auVar14);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d72c9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d72e7);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pSVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar10,auVar15);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d7337);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d7355);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pSVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar11,auVar16);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d73a5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d73c3);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pSVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar12,auVar17);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d7413);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff88,0x9d7431);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *pSVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar13,auVar18);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow38_00010_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,60) / groebnerMatrix(38,74);
  groebnerMatrix(targetRow,60) = 0.0;
  groebnerMatrix(targetRow,61) -= factor * groebnerMatrix(38,75);
  groebnerMatrix(targetRow,63) -= factor * groebnerMatrix(38,76);
  groebnerMatrix(targetRow,66) -= factor * groebnerMatrix(38,77);
  groebnerMatrix(targetRow,70) -= factor * groebnerMatrix(38,78);
  groebnerMatrix(targetRow,75) -= factor * groebnerMatrix(38,79);
}